

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

void __thiscall
QOpenGLShaderProgram::setUniformValueArray
          (QOpenGLShaderProgram *this,int location,QMatrix4x4 *values,int count)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  QVarLengthArray<float,_256LL> temp;
  QVarLengthArray<float,_256LL> QStack_448;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < count && location != -1) {
    lVar1 = *(long *)&this->field_0x8;
    memset(&QStack_448,0xaa,0x418);
    QVarLengthArray<float,_256LL>::QVarLengthArray(&QStack_448,(ulong)(uint)(count << 4));
    for (uVar2 = 0; uVar2 != (uint)count; uVar2 = uVar2 + 1) {
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        *(float *)((long)QStack_448.super_QVLABase<float>.super_QVLABaseBase.ptr +
                  lVar3 * 4 + (ulong)((uint)uVar2 & 0xfffffff) * 0x40) = values->m[0][lVar3];
      }
      values = values + 1;
    }
    (**(code **)(**(long **)(lVar1 + 0xd0) + 0x410))(location,count,0);
    QVarLengthArray<float,_256LL>::~QVarLengthArray(&QStack_448);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValueArray(int location, const QMatrix4x4 *values, int count)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    setUniformMatrixArray
        (d->glfuncs->glUniformMatrix4fv, location, values, count, QMatrix4x4, 4, 4);
}